

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_int,unsigned_int>
          (Thread *this,BinopFunc<unsigned_int,_unsigned_int> *f)

{
  uint uVar1;
  uint uVar2;
  Simd<unsigned_int,_(unsigned_char)__x04_> SVar3;
  byte local_3d;
  undefined8 uStack_3c;
  u8 i;
  SR result;
  Simd<unsigned_int,_(unsigned_char)__x04_> lhs;
  uint amount;
  BinopFunc<unsigned_int,_unsigned_int> *f_local;
  Thread *this_local;
  
  uVar1 = Pop<unsigned_int>(this);
  SVar3 = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  result.v[2] = SVar3.v[0];
  result.v[3] = SVar3.v[1];
  lhs.v[0] = SVar3.v[2];
  lhs.v[1] = SVar3.v[3];
  for (local_3d = 0; local_3d < 4; local_3d = local_3d + 1) {
    uVar2 = (*f)(result.v[(ulong)local_3d + 2],uVar1);
    lhs.v[(ulong)local_3d - 6] = uVar2;
  }
  SVar3.v[2] = result.v[0];
  SVar3.v[3] = result.v[1];
  SVar3.v._0_8_ = uStack_3c;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,SVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<T>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}